

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::dropEvent(UEFITool *this,QDropEvent *event)

{
  QString path;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<QUrl> local_28;
  
  QMimeData::urls();
  QUrl::toLocalFile();
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_28);
  local_58.d = local_40.d;
  local_58.ptr = local_40.ptr;
  local_58.size = local_40.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  openImageFile(this,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  return;
}

Assistant:

void UEFITool::dropEvent(QDropEvent* event)
{
    QString path = event->mimeData()->urls().at(0).toLocalFile();
    openImageFile(path);
}